

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_loshelf2_get_heap_size(ma_loshelf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  undefined4 *in_RDI;
  double dVar2;
  size_t *pHeapSizeInBytes_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  double sqrtA;
  double a;
  double S;
  double A;
  double c;
  double s;
  double w;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined1 local_c0 [72];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined4 *local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_48 = (*(double *)(in_RDI + 8) * 6.283185307179586) / (double)(uint)in_RDI[2];
  local_40 = in_RDI;
  local_18 = local_48;
  local_50 = sin(local_48);
  local_10 = local_48;
  local_8 = 1.5707963267948966 - local_48;
  local_58 = sin(local_8);
  local_28 = *(double *)(local_40 + 4) / 40.0;
  local_20 = 0x4024000000000000;
  local_60 = pow(10.0,local_28);
  local_68 = *(double *)(local_40 + 6);
  dVar2 = local_50 / 2.0;
  local_30 = (local_60 + 1.0 / local_60) * (1.0 / local_68 - 1.0) + 2.0;
  local_70 = sqrt(local_30);
  local_70 = dVar2 * local_70;
  local_38 = local_60;
  dVar2 = sqrt(local_60);
  local_78 = dVar2 * 2.0 * local_70;
  pHeapSizeInBytes_00 =
       (size_t *)(local_60 * (-(local_60 - 1.0) * local_58 + local_60 + 1.0 + local_78));
  pConfig_00 = (ma_biquad_config *)
               (local_60 * 2.0 * (-(local_60 + 1.0) * local_58 + (local_60 - 1.0)));
  local_f8 = *local_40;
  local_f4 = local_40[1];
  memcpy(local_c0,&local_f8,0x38);
  mVar1 = ma_biquad_get_heap_size(pConfig_00,pHeapSizeInBytes_00);
  return mVar1;
}

Assistant:

MA_API ma_result ma_loshelf2_get_heap_size(const ma_loshelf2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_loshelf2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}